

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O2

void opj_pi_create_encode
               (opj_pi_iterator_t *pi,opj_cp_t *cp,OPJ_UINT32 tileno,OPJ_UINT32 pino,
               OPJ_UINT32 tpnum,OPJ_INT32 tppos,J2K_T2_MODE t2_mode)

{
  undefined4 uVar1;
  undefined4 uVar2;
  char cVar3;
  OPJ_PROG_ORDER OVar4;
  uint uVar5;
  uint uVar6;
  opj_tcp_t *poVar7;
  ushort uVar8;
  bool bVar9;
  bool bVar10;
  OPJ_UINT32 OVar11;
  bool bVar12;
  OPJ_BOOL OVar13;
  OPJ_UINT32 OVar14;
  uint uVar15;
  char *prog;
  long lVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  OPJ_UINT32 OVar20;
  
  uVar18 = (ulong)(uint)tppos;
  poVar7 = cp->tcps;
  prog = opj_j2k_convert_progression_order(poVar7[tileno].pocs[pino].prg);
  pi[pino].first = 1;
  OVar4 = poVar7[tileno].pocs[pino].prg;
  pi[pino].poc.prg = OVar4;
  if ((*(byte *)((long)&cp->m_specific_param + 0x18) & 1) == 0) goto code_r0x00127ff2;
  uVar8 = (ushort)*(undefined4 *)cp;
  if (3 < (ushort)(uVar8 - 3)) {
    if (uVar8 < 0x400) {
      if (t2_mode != FINAL_PASS) goto code_r0x00127ff2;
    }
    else if (0x99b < uVar8 && t2_mode != FINAL_PASS) {
code_r0x00127ff2:
      OVar14 = poVar7[tileno].pocs[pino].resS;
      OVar20 = poVar7[tileno].pocs[pino].compS;
      pi[pino].poc.compno1 = poVar7[tileno].pocs[pino].compE;
      pi[pino].poc.layno0 = poVar7[tileno].pocs[pino].layS;
      uVar1 = poVar7[tileno].pocs[pino].layE;
      uVar2 = poVar7[tileno].pocs[pino].resE;
      pi[pino].poc.resno0 = OVar14;
      pi[pino].poc.compno0 = OVar20;
      pi[pino].poc.layno1 = uVar1;
      pi[pino].poc.resno1 = uVar2;
      pi[pino].poc.precno0 = poVar7[tileno].pocs[pino].prcS;
      pi[pino].poc.precno1 = poVar7[tileno].pocs[pino].prcE;
      OVar14 = poVar7[tileno].pocs[pino].txE;
      OVar20 = poVar7[tileno].pocs[pino].tyS;
      OVar11 = poVar7[tileno].pocs[pino].tyE;
      pi[pino].poc.tx0 = poVar7[tileno].pocs[pino].txS;
      pi[pino].poc.tx1 = OVar14;
      pi[pino].poc.ty0 = OVar20;
      pi[pino].poc.ty1 = OVar11;
      return;
    }
  }
  for (lVar16 = (long)tppos; lVar16 < 3; lVar16 = lVar16 + 1) {
    cVar3 = prog[lVar16 + 1];
    if (cVar3 == 'C') {
      pi[pino].poc.compno0 = poVar7[tileno].pocs[pino].compS;
      pi[pino].poc.compno1 = poVar7[tileno].pocs[pino].compE;
    }
    else if (cVar3 == 'L') {
      pi[pino].poc.layno0 = poVar7[tileno].pocs[pino].layS;
      pi[pino].poc.layno1 = poVar7[tileno].pocs[pino].layE;
    }
    else if (cVar3 == 'P') {
      if ((uint)OVar4 < 2) {
        pi[pino].poc.precno0 = poVar7[tileno].pocs[pino].prcS;
        pi[pino].poc.precno1 = poVar7[tileno].pocs[pino].prcE;
      }
      else {
        OVar14 = poVar7[tileno].pocs[pino].txE;
        OVar20 = poVar7[tileno].pocs[pino].tyS;
        OVar11 = poVar7[tileno].pocs[pino].tyE;
        pi[pino].poc.tx0 = poVar7[tileno].pocs[pino].txS;
        pi[pino].poc.tx1 = OVar14;
        pi[pino].poc.ty0 = OVar20;
        pi[pino].poc.ty1 = OVar11;
      }
    }
    else if (cVar3 == 'R') {
      pi[pino].poc.resno0 = poVar7[tileno].pocs[pino].resS;
      pi[pino].poc.resno1 = poVar7[tileno].pocs[pino].resE;
    }
  }
  if (tpnum == 0) {
    for (; -1 < (int)uVar18; uVar18 = (ulong)((int)uVar18 - 1)) {
      cVar3 = prog[uVar18];
      if (cVar3 == 'R') {
        OVar14 = poVar7[tileno].pocs[pino].resS;
        pi[pino].poc.resno0 = OVar14;
        OVar14 = OVar14 + 1;
        pi[pino].poc.resno1 = OVar14;
        poVar7[tileno].pocs[pino].res_t = OVar14;
      }
      else if (cVar3 == 'L') {
        OVar14 = poVar7[tileno].pocs[pino].layS;
        pi[pino].poc.layno0 = OVar14;
        OVar14 = OVar14 + 1;
        pi[pino].poc.layno1 = OVar14;
        poVar7[tileno].pocs[pino].lay_t = OVar14;
      }
      else if (cVar3 == 'P') {
        if ((uint)OVar4 < 2) {
          OVar14 = poVar7[tileno].pocs[pino].prcS;
          pi[pino].poc.precno0 = OVar14;
          OVar14 = OVar14 + 1;
          pi[pino].poc.precno1 = OVar14;
          poVar7[tileno].pocs[pino].prc_t = OVar14;
        }
        else {
          uVar15 = poVar7[tileno].pocs[pino].txS;
          uVar5 = poVar7[tileno].pocs[pino].tyS;
          pi[pino].poc.tx0 = uVar15;
          uVar6 = poVar7[tileno].pocs[pino].dx;
          OVar14 = (uVar6 + uVar15) - uVar15 % uVar6;
          pi[pino].poc.tx1 = OVar14;
          pi[pino].poc.ty0 = uVar5;
          uVar15 = poVar7[tileno].pocs[pino].dy;
          OVar20 = (uVar15 + uVar5) - uVar5 % uVar15;
          pi[pino].poc.ty1 = OVar20;
          poVar7[tileno].pocs[pino].tx0_t = OVar14;
          poVar7[tileno].pocs[pino].ty0_t = OVar20;
        }
      }
      else if (cVar3 == 'C') {
        OVar14 = poVar7[tileno].pocs[pino].compS;
        pi[pino].poc.compno0 = OVar14;
        OVar14 = OVar14 + 1;
        pi[pino].poc.compno1 = OVar14;
        poVar7[tileno].pocs[pino].comp_t = OVar14;
      }
    }
  }
  else {
    bVar9 = true;
    while (iVar17 = (int)uVar18, -1 < iVar17) {
      cVar3 = prog[uVar18];
      if (cVar3 == 'R') {
        OVar14 = poVar7[tileno].pocs[pino].res_t;
        pi[pino].poc.resno0 = OVar14 - 1;
        pi[pino].poc.resno1 = OVar14;
      }
      else if (cVar3 == 'L') {
        OVar14 = poVar7[tileno].pocs[pino].lay_t;
        pi[pino].poc.layno0 = OVar14 - 1;
        pi[pino].poc.layno1 = OVar14;
      }
      else if (cVar3 == 'P') {
        if ((uint)OVar4 < 2) {
          OVar14 = poVar7[tileno].pocs[pino].prc_t;
          pi[pino].poc.precno0 = OVar14 - 1;
          pi[pino].poc.precno1 = OVar14;
        }
        else {
          uVar15 = poVar7[tileno].pocs[pino].dx;
          uVar5 = poVar7[tileno].pocs[pino].tx0_t;
          pi[pino].poc.tx0 = uVar5 - (uVar5 % uVar15 + uVar15);
          pi[pino].poc.tx1 = uVar5;
          uVar15 = poVar7[tileno].pocs[pino].dy;
          uVar5 = poVar7[tileno].pocs[pino].ty0_t;
          pi[pino].poc.ty0 = uVar5 - (uVar5 % uVar15 + uVar15);
          pi[pino].poc.ty1 = uVar5;
        }
      }
      else if (cVar3 == 'C') {
        OVar14 = poVar7[tileno].pocs[pino].comp_t;
        pi[pino].poc.compno0 = OVar14 - 1;
        pi[pino].poc.compno1 = OVar14;
      }
      bVar10 = false;
      bVar12 = false;
      if (bVar9) {
        cVar3 = prog[uVar18];
        bVar12 = bVar10;
        if (cVar3 == 'C') {
          OVar14 = poVar7[tileno].pocs[pino].comp_t;
          if (OVar14 == poVar7[tileno].pocs[pino].compE) {
            OVar13 = opj_pi_check_next_level(iVar17 + -1,cp,tileno,pino,prog);
            bVar12 = false;
            if (OVar13 != 0) {
              OVar14 = poVar7[tileno].pocs[pino].compS;
              pi[pino].poc.compno0 = OVar14;
              OVar14 = OVar14 + 1;
              pi[pino].poc.compno1 = OVar14;
              poVar7[tileno].pocs[pino].comp_t = OVar14;
LAB_0012838e:
              bVar12 = true;
            }
          }
          else {
            pi[pino].poc.compno0 = OVar14;
            pi[pino].poc.compno1 = OVar14 + 1;
            poVar7[tileno].pocs[pino].comp_t = OVar14 + 1;
          }
        }
        else if (cVar3 == 'L') {
          OVar14 = poVar7[tileno].pocs[pino].lay_t;
          if (OVar14 == poVar7[tileno].pocs[pino].layE) {
            OVar13 = opj_pi_check_next_level(iVar17 + -1,cp,tileno,pino,prog);
            bVar12 = false;
            if (OVar13 != 0) {
              OVar14 = poVar7[tileno].pocs[pino].layS;
              pi[pino].poc.layno0 = OVar14;
              OVar14 = OVar14 + 1;
              pi[pino].poc.layno1 = OVar14;
              poVar7[tileno].pocs[pino].lay_t = OVar14;
              goto LAB_0012838e;
            }
          }
          else {
            pi[pino].poc.layno0 = OVar14;
            pi[pino].poc.layno1 = OVar14 + 1;
            poVar7[tileno].pocs[pino].lay_t = OVar14 + 1;
          }
        }
        else if (cVar3 == 'P') {
          if ((uint)OVar4 < 2) {
            OVar14 = poVar7[tileno].pocs[pino].prc_t;
            if (OVar14 == poVar7[tileno].pocs[pino].prcE) {
              OVar13 = opj_pi_check_next_level(iVar17 + -1,cp,tileno,pino,prog);
              bVar12 = false;
              if (OVar13 != 0) {
                OVar14 = poVar7[tileno].pocs[pino].prcS;
                pi[pino].poc.precno0 = OVar14;
                OVar14 = OVar14 + 1;
                pi[pino].poc.precno1 = OVar14;
                poVar7[tileno].pocs[pino].prc_t = OVar14;
                goto LAB_0012838e;
              }
            }
            else {
              pi[pino].poc.precno0 = OVar14;
              pi[pino].poc.precno1 = OVar14 + 1;
              poVar7[tileno].pocs[pino].prc_t = OVar14 + 1;
            }
          }
          else {
            uVar15 = poVar7[tileno].pocs[pino].tx0_t;
            if (uVar15 < poVar7[tileno].pocs[pino].txE) {
              pi[pino].poc.tx0 = uVar15;
              OVar14 = poVar7[tileno].pocs[pino].dx;
              iVar19 = OVar14 + uVar15;
              bVar12 = false;
            }
            else {
              uVar15 = poVar7[tileno].pocs[pino].ty0_t;
              bVar12 = false;
              if (poVar7[tileno].pocs[pino].tyE <= uVar15) {
                OVar13 = opj_pi_check_next_level(iVar17 + -1,cp,tileno,pino,prog);
                if (OVar13 == 0) {
                  bVar12 = false;
                  goto LAB_00128487;
                }
                uVar15 = poVar7[tileno].pocs[pino].tyS;
                bVar12 = true;
              }
              pi[pino].poc.ty0 = uVar15;
              uVar5 = poVar7[tileno].pocs[pino].dy;
              OVar14 = (uVar5 + uVar15) - uVar15 % uVar5;
              pi[pino].poc.ty1 = OVar14;
              poVar7[tileno].pocs[pino].ty0_t = OVar14;
              uVar15 = poVar7[tileno].pocs[pino].txS;
              pi[pino].poc.tx0 = uVar15;
              OVar14 = poVar7[tileno].pocs[pino].dx;
              iVar19 = OVar14 + uVar15;
            }
            OVar14 = iVar19 - uVar15 % OVar14;
            pi[pino].poc.tx1 = OVar14;
            poVar7[tileno].pocs[pino].tx0_t = OVar14;
          }
        }
        else {
          bVar12 = true;
          if (cVar3 == 'R') {
            OVar14 = poVar7[tileno].pocs[pino].res_t;
            if (OVar14 == poVar7[tileno].pocs[pino].resE) {
              OVar13 = opj_pi_check_next_level(iVar17 + -1,cp,tileno,pino,prog);
              bVar12 = false;
              if (OVar13 != 0) {
                OVar14 = poVar7[tileno].pocs[pino].resS;
                pi[pino].poc.resno0 = OVar14;
                OVar14 = OVar14 + 1;
                pi[pino].poc.resno1 = OVar14;
                poVar7[tileno].pocs[pino].res_t = OVar14;
                goto LAB_0012838e;
              }
            }
            else {
              pi[pino].poc.resno0 = OVar14;
              pi[pino].poc.resno1 = OVar14 + 1;
              poVar7[tileno].pocs[pino].res_t = OVar14 + 1;
              bVar12 = false;
            }
          }
        }
      }
LAB_00128487:
      bVar9 = bVar12;
      uVar18 = (ulong)(iVar17 - 1);
    }
  }
  return;
}

Assistant:

void opj_pi_create_encode(opj_pi_iterator_t *pi,
                          opj_cp_t *cp,
                          OPJ_UINT32 tileno,
                          OPJ_UINT32 pino,
                          OPJ_UINT32 tpnum,
                          OPJ_INT32 tppos,
                          J2K_T2_MODE t2_mode)
{
    const OPJ_CHAR *prog;
    OPJ_INT32 i;
    OPJ_UINT32 incr_top = 1, resetX = 0;
    opj_tcp_t *tcps = &cp->tcps[tileno];
    opj_poc_t *tcp = &tcps->pocs[pino];

    prog = opj_j2k_convert_progression_order(tcp->prg);

    pi[pino].first = 1;
    pi[pino].poc.prg = tcp->prg;

    if (!(cp->m_specific_param.m_enc.m_tp_on && ((!OPJ_IS_CINEMA(cp->rsiz) &&
            !OPJ_IS_IMF(cp->rsiz) &&
            (t2_mode == FINAL_PASS)) || OPJ_IS_CINEMA(cp->rsiz) || OPJ_IS_IMF(cp->rsiz)))) {
        pi[pino].poc.resno0 = tcp->resS;
        pi[pino].poc.resno1 = tcp->resE;
        pi[pino].poc.compno0 = tcp->compS;
        pi[pino].poc.compno1 = tcp->compE;
        pi[pino].poc.layno0 = tcp->layS;
        pi[pino].poc.layno1 = tcp->layE;
        pi[pino].poc.precno0 = tcp->prcS;
        pi[pino].poc.precno1 = tcp->prcE;
        pi[pino].poc.tx0 = tcp->txS;
        pi[pino].poc.ty0 = tcp->tyS;
        pi[pino].poc.tx1 = tcp->txE;
        pi[pino].poc.ty1 = tcp->tyE;
    } else {
        for (i = tppos + 1; i < 4; i++) {
            switch (prog[i]) {
            case 'R':
                pi[pino].poc.resno0 = tcp->resS;
                pi[pino].poc.resno1 = tcp->resE;
                break;
            case 'C':
                pi[pino].poc.compno0 = tcp->compS;
                pi[pino].poc.compno1 = tcp->compE;
                break;
            case 'L':
                pi[pino].poc.layno0 = tcp->layS;
                pi[pino].poc.layno1 = tcp->layE;
                break;
            case 'P':
                switch (tcp->prg) {
                case OPJ_LRCP:
                case OPJ_RLCP:
                    pi[pino].poc.precno0 = tcp->prcS;
                    pi[pino].poc.precno1 = tcp->prcE;
                    break;
                default:
                    pi[pino].poc.tx0 = tcp->txS;
                    pi[pino].poc.ty0 = tcp->tyS;
                    pi[pino].poc.tx1 = tcp->txE;
                    pi[pino].poc.ty1 = tcp->tyE;
                    break;
                }
                break;
            }
        }

        if (tpnum == 0) {
            for (i = tppos; i >= 0; i--) {
                switch (prog[i]) {
                case 'C':
                    tcp->comp_t = tcp->compS;
                    pi[pino].poc.compno0 = tcp->comp_t;
                    pi[pino].poc.compno1 = tcp->comp_t + 1;
                    tcp->comp_t += 1;
                    break;
                case 'R':
                    tcp->res_t = tcp->resS;
                    pi[pino].poc.resno0 = tcp->res_t;
                    pi[pino].poc.resno1 = tcp->res_t + 1;
                    tcp->res_t += 1;
                    break;
                case 'L':
                    tcp->lay_t = tcp->layS;
                    pi[pino].poc.layno0 = tcp->lay_t;
                    pi[pino].poc.layno1 = tcp->lay_t + 1;
                    tcp->lay_t += 1;
                    break;
                case 'P':
                    switch (tcp->prg) {
                    case OPJ_LRCP:
                    case OPJ_RLCP:
                        tcp->prc_t = tcp->prcS;
                        pi[pino].poc.precno0 = tcp->prc_t;
                        pi[pino].poc.precno1 = tcp->prc_t + 1;
                        tcp->prc_t += 1;
                        break;
                    default:
                        tcp->tx0_t = tcp->txS;
                        tcp->ty0_t = tcp->tyS;
                        pi[pino].poc.tx0 = tcp->tx0_t;
                        pi[pino].poc.tx1 = tcp->tx0_t + tcp->dx - (tcp->tx0_t % tcp->dx);
                        pi[pino].poc.ty0 = tcp->ty0_t;
                        pi[pino].poc.ty1 = tcp->ty0_t + tcp->dy - (tcp->ty0_t % tcp->dy);
                        tcp->tx0_t = (OPJ_UINT32)pi[pino].poc.tx1;
                        tcp->ty0_t = (OPJ_UINT32)pi[pino].poc.ty1;
                        break;
                    }
                    break;
                }
            }
            incr_top = 1;
        } else {
            for (i = tppos; i >= 0; i--) {
                switch (prog[i]) {
                case 'C':
                    pi[pino].poc.compno0 = tcp->comp_t - 1;
                    pi[pino].poc.compno1 = tcp->comp_t;
                    break;
                case 'R':
                    pi[pino].poc.resno0 = tcp->res_t - 1;
                    pi[pino].poc.resno1 = tcp->res_t;
                    break;
                case 'L':
                    pi[pino].poc.layno0 = tcp->lay_t - 1;
                    pi[pino].poc.layno1 = tcp->lay_t;
                    break;
                case 'P':
                    switch (tcp->prg) {
                    case OPJ_LRCP:
                    case OPJ_RLCP:
                        pi[pino].poc.precno0 = tcp->prc_t - 1;
                        pi[pino].poc.precno1 = tcp->prc_t;
                        break;
                    default:
                        pi[pino].poc.tx0 = tcp->tx0_t - tcp->dx - (tcp->tx0_t % tcp->dx);
                        pi[pino].poc.tx1 = tcp->tx0_t ;
                        pi[pino].poc.ty0 = tcp->ty0_t - tcp->dy - (tcp->ty0_t % tcp->dy);
                        pi[pino].poc.ty1 = tcp->ty0_t ;
                        break;
                    }
                    break;
                }
                if (incr_top == 1) {
                    switch (prog[i]) {
                    case 'R':
                        if (tcp->res_t == tcp->resE) {
                            if (opj_pi_check_next_level(i - 1, cp, tileno, pino, prog)) {
                                tcp->res_t = tcp->resS;
                                pi[pino].poc.resno0 = tcp->res_t;
                                pi[pino].poc.resno1 = tcp->res_t + 1;
                                tcp->res_t += 1;
                                incr_top = 1;
                            } else {
                                incr_top = 0;
                            }
                        } else {
                            pi[pino].poc.resno0 = tcp->res_t;
                            pi[pino].poc.resno1 = tcp->res_t + 1;
                            tcp->res_t += 1;
                            incr_top = 0;
                        }
                        break;
                    case 'C':
                        if (tcp->comp_t == tcp->compE) {
                            if (opj_pi_check_next_level(i - 1, cp, tileno, pino, prog)) {
                                tcp->comp_t = tcp->compS;
                                pi[pino].poc.compno0 = tcp->comp_t;
                                pi[pino].poc.compno1 = tcp->comp_t + 1;
                                tcp->comp_t += 1;
                                incr_top = 1;
                            } else {
                                incr_top = 0;
                            }
                        } else {
                            pi[pino].poc.compno0 = tcp->comp_t;
                            pi[pino].poc.compno1 = tcp->comp_t + 1;
                            tcp->comp_t += 1;
                            incr_top = 0;
                        }
                        break;
                    case 'L':
                        if (tcp->lay_t == tcp->layE) {
                            if (opj_pi_check_next_level(i - 1, cp, tileno, pino, prog)) {
                                tcp->lay_t = tcp->layS;
                                pi[pino].poc.layno0 = tcp->lay_t;
                                pi[pino].poc.layno1 = tcp->lay_t + 1;
                                tcp->lay_t += 1;
                                incr_top = 1;
                            } else {
                                incr_top = 0;
                            }
                        } else {
                            pi[pino].poc.layno0 = tcp->lay_t;
                            pi[pino].poc.layno1 = tcp->lay_t + 1;
                            tcp->lay_t += 1;
                            incr_top = 0;
                        }
                        break;
                    case 'P':
                        switch (tcp->prg) {
                        case OPJ_LRCP:
                        case OPJ_RLCP:
                            if (tcp->prc_t == tcp->prcE) {
                                if (opj_pi_check_next_level(i - 1, cp, tileno, pino, prog)) {
                                    tcp->prc_t = tcp->prcS;
                                    pi[pino].poc.precno0 = tcp->prc_t;
                                    pi[pino].poc.precno1 = tcp->prc_t + 1;
                                    tcp->prc_t += 1;
                                    incr_top = 1;
                                } else {
                                    incr_top = 0;
                                }
                            } else {
                                pi[pino].poc.precno0 = tcp->prc_t;
                                pi[pino].poc.precno1 = tcp->prc_t + 1;
                                tcp->prc_t += 1;
                                incr_top = 0;
                            }
                            break;
                        default:
                            if (tcp->tx0_t >= tcp->txE) {
                                if (tcp->ty0_t >= tcp->tyE) {
                                    if (opj_pi_check_next_level(i - 1, cp, tileno, pino, prog)) {
                                        tcp->ty0_t = tcp->tyS;
                                        pi[pino].poc.ty0 = tcp->ty0_t;
                                        pi[pino].poc.ty1 = tcp->ty0_t + tcp->dy - (tcp->ty0_t % tcp->dy);
                                        tcp->ty0_t = (OPJ_UINT32)pi[pino].poc.ty1;
                                        incr_top = 1;
                                        resetX = 1;
                                    } else {
                                        incr_top = 0;
                                        resetX = 0;
                                    }
                                } else {
                                    pi[pino].poc.ty0 = tcp->ty0_t;
                                    pi[pino].poc.ty1 = tcp->ty0_t + tcp->dy - (tcp->ty0_t % tcp->dy);
                                    tcp->ty0_t = (OPJ_UINT32)pi[pino].poc.ty1;
                                    incr_top = 0;
                                    resetX = 1;
                                }
                                if (resetX == 1) {
                                    tcp->tx0_t = tcp->txS;
                                    pi[pino].poc.tx0 = tcp->tx0_t;
                                    pi[pino].poc.tx1 = tcp->tx0_t + tcp->dx - (tcp->tx0_t % tcp->dx);
                                    tcp->tx0_t = (OPJ_UINT32)pi[pino].poc.tx1;
                                }
                            } else {
                                pi[pino].poc.tx0 = tcp->tx0_t;
                                pi[pino].poc.tx1 = tcp->tx0_t + tcp->dx - (tcp->tx0_t % tcp->dx);
                                tcp->tx0_t = (OPJ_UINT32)pi[pino].poc.tx1;
                                incr_top = 0;
                            }
                            break;
                        }
                        break;
                    }
                }
            }
        }
    }
}